

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_version(void)

{
  float version;
  char cfitsioversion [40];
  float local_3c;
  char local_38 [40];
  
  printf("%s","1.7.0 (Dec 2013)");
  ffvers(&local_3c);
  snprintf(local_38,0x28," CFITSIO version %5.3f",(double)local_3c);
  printf("%s",local_38);
  putchar(10);
  return 0;
}

Assistant:

int fp_version (void)
{
        float version;
        char cfitsioversion[40];

        fp_msg (FPACK_VERSION);
        fits_get_version(&version);
        snprintf(cfitsioversion, 40," CFITSIO version %5.3f", version);
        fp_msg(cfitsioversion);
        fp_msg ("\n");
        return(0);
}